

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitstream.cpp
# Opt level: O2

ConstantValue *
slang::ast::Bitstream::reOrder
          (ConstantValue *__return_storage_ptr__,ConstantValue *value,size_t sliceSize,
          size_t unpackWidth)

{
  ConstantValue *__args;
  size_t sVar1;
  ulong uVar2;
  reference ppCVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  size_t sVar7;
  bitwidth_t bVar8;
  pointer iter;
  size_type sVar9;
  size_type sVar10;
  long lVar11;
  PackIterator iter_00;
  bool bVar12;
  bitwidth_t rightWidth;
  size_type local_e0;
  PackIterator local_d8;
  bitwidth_t bit;
  vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> result;
  SmallVector<slang::ConstantValue_*,_5UL> packed;
  ast local_58 [16];
  anon_class_24_3_4aefb7ac sliceOrAppend;
  
  sVar1 = ConstantValue::bitstreamWidth(value);
  if (sVar1 < unpackWidth) {
    assert::assertFailed
              ("unpackWidth <= totalWidth",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Bitstream.cpp"
               ,0x22d,
               "static ConstantValue slang::ast::Bitstream::reOrder(ConstantValue &&, size_t, size_t)"
              );
  }
  sVar7 = unpackWidth;
  if (unpackWidth == 0) {
    sVar7 = sVar1;
  }
  uVar2 = ((sVar7 + sliceSize) - 1) / sliceSize;
  if (uVar2 < 2) {
    std::__detail::__variant::
    _Move_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    ::_Move_ctor_base((_Move_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       *)__return_storage_ptr__,
                      (_Move_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       *)value);
  }
  else {
    packed.super_SmallVectorBase<slang::ConstantValue_*>.data_ =
         (pointer)packed.super_SmallVectorBase<slang::ConstantValue_*>.firstElement;
    packed.super_SmallVectorBase<slang::ConstantValue_*>.len = 0;
    packed.super_SmallVectorBase<slang::ConstantValue_*>.cap = 5;
    packBitstream(value,&packed.super_SmallVectorBase<slang::ConstantValue_*>);
    local_e0 = packed.super_SmallVectorBase<slang::ConstantValue_*>.len;
    if (packed.super_SmallVectorBase<slang::ConstantValue_*>.len == 0) {
      std::__detail::__variant::
      _Move_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ::_Move_ctor_base((_Move_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                         *)__return_storage_ptr__,
                        (_Move_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                         *)value);
    }
    else {
      ppCVar3 = SmallVectorBase<slang::ConstantValue_*>::back
                          (&packed.super_SmallVectorBase<slang::ConstantValue_*>);
      uVar4 = ConstantValue::bitstreamWidth(*ppCVar3);
      local_e0 = local_e0 - 1;
      rightWidth = (bitwidth_t)uVar4;
      if (unpackWidth == 0) {
        sVar1 = 0;
      }
      else {
        if (unpackWidth <= sVar1 && sVar1 - unpackWidth != 0) {
          uVar6 = sVar1 - unpackWidth;
          while (uVar5 = uVar4 & 0xffffffff, uVar5 <= uVar6) {
            local_e0 = local_e0 - 1;
            ppCVar3 = SmallVectorBase<slang::ConstantValue_*>::operator[]
                                (&packed.super_SmallVectorBase<slang::ConstantValue_*>,local_e0);
            uVar4 = ConstantValue::bitstreamWidth(*ppCVar3);
            rightWidth = (bitwidth_t)uVar4;
            uVar6 = uVar6 - uVar5;
          }
          rightWidth = (int)uVar4 - (int)uVar6;
        }
        sVar1 = unpackWidth % sliceSize;
      }
      result.super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)0x0;
      result.super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)0x0;
      result.super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      sVar9 = packed.super_SmallVectorBase<slang::ConstantValue_*>.len;
      if (packed.super_SmallVectorBase<slang::ConstantValue_*>.len <= uVar2) {
        sVar9 = uVar2;
      }
      std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::reserve
                (&result,sVar9);
      sliceOrAppend.rightWidth = &rightWidth;
      sliceOrAppend.packed = &packed;
      sliceOrAppend.result = &result;
      for (; 1 < uVar2; uVar2 = uVar2 - 1) {
        sVar7 = (size_t)rightWidth;
        if (sVar1 == 0) {
          sVar1 = sliceSize;
        }
        lVar11 = local_e0 * 8;
        uVar4 = 1;
        sVar9 = local_e0;
        while( true ) {
          bVar8 = (bitwidth_t)sVar7;
          uVar6 = sVar7 & 0xffffffff;
          if (sVar1 < uVar6) break;
          sVar9 = sVar9 - 1;
          ppCVar3 = SmallVectorBase<slang::ConstantValue_*>::operator[]
                              (&packed.super_SmallVectorBase<slang::ConstantValue_*>,sVar9);
          sVar7 = ConstantValue::bitstreamWidth(*ppCVar3);
          lVar11 = lVar11 + -8;
          uVar4 = uVar4 - 1;
          sVar1 = sVar1 - uVar6;
        }
        local_d8 = (PackIterator)
                   (lVar11 + (long)packed.super_SmallVectorBase<slang::ConstantValue_*>.data_);
        sVar10 = local_e0;
        if (sVar1 != 0) {
          bVar8 = bVar8 - (bitwidth_t)sVar1;
          bit = bVar8;
          slicePacked(local_58,&local_d8,
                      packed.super_SmallVectorBase<slang::ConstantValue_*>.data_ +
                      packed.super_SmallVectorBase<slang::ConstantValue_*>.len,&bit,
                      (bitwidth_t)sVar1);
          sVar10 = local_e0;
          std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::
          emplace_back<slang::SVInt>(&result,(SVInt *)local_58);
          SVInt::~SVInt((SVInt *)local_58);
        }
        iter_00 = local_d8 + 1;
        local_d8 = iter_00;
        for (; CARRY8(sVar10,uVar4); uVar4 = uVar4 + 1) {
          __args = *iter_00;
          iter_00 = iter_00 + 1;
          std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::
          emplace_back<slang::ConstantValue>(&result,__args);
        }
        local_d8 = iter_00;
        if (uVar4 == 0) {
          reOrder::anon_class_24_3_4aefb7ac::operator()(&sliceOrAppend,iter_00);
        }
        sVar1 = 0;
        rightWidth = bVar8;
        local_e0 = sVar9;
      }
      iter = packed.super_SmallVectorBase<slang::ConstantValue_*>.data_;
      sVar9 = local_e0;
      while (bVar12 = sVar9 != 0, sVar9 = sVar9 - 1, bVar12) {
        std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::
        emplace_back<slang::ConstantValue>(&result,*iter);
        iter = iter + 1;
      }
      reOrder::anon_class_24_3_4aefb7ac::operator()(&sliceOrAppend,iter);
      *(pointer *)
       &(__return_storage_ptr__->value).
        super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        .
        super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        .
        super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        .
        super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        .
        super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        .
        super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           = result.super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
             _M_impl.super__Vector_impl_data._M_start;
      *(pointer *)
       ((long)&(__return_storage_ptr__->value).
               super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
       + 8) = result.super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
              ._M_impl.super__Vector_impl_data._M_finish;
      *(pointer *)
       ((long)&(__return_storage_ptr__->value).
               super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
       + 0x10) = result.
                 super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
      result.super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)0x0;
      result.super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)0x0;
      result.super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->value).
               super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
       + 0x20) = '\x05';
      std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::~vector(&result);
    }
    SmallVectorBase<slang::ConstantValue_*>::~SmallVectorBase
              (&packed.super_SmallVectorBase<slang::ConstantValue_*>);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstantValue Bitstream::reOrder(ConstantValue&& value, size_t sliceSize, size_t unpackWidth) {
    size_t totalWidth = value.bitstreamWidth();
    ASSERT(unpackWidth <= totalWidth);

    size_t numBlocks = ((unpackWidth ? unpackWidth : totalWidth) + sliceSize - 1) / sliceSize;
    if (numBlocks <= 1)
        return std::move(value);

    SmallVector<ConstantValue*> packed;
    packBitstream(value, packed);
    if (packed.empty())
        return std::move(value);

    size_t rightIndex = packed.size() - 1; // Right-to-left
    bitwidth_t rightWidth = static_cast<bitwidth_t>(packed.back()->bitstreamWidth());
    size_t extraBits = 0;

    if (unpackWidth) {
        if (unpackWidth < totalWidth) { // left-aligned so trim rightmost
            auto trimWidth = totalWidth - unpackWidth;
            while (trimWidth >= rightWidth) {
                rightIndex--;
                trimWidth -= rightWidth;
                rightWidth = static_cast<bitwidth_t>(packed[rightIndex]->bitstreamWidth());
            }
            rightWidth -= static_cast<bitwidth_t>(trimWidth);
        }

        // For unpack, extraBits is for the first block.
        // For pack, extraBits is for the last block.
        extraBits = unpackWidth % sliceSize;
    }

    std::vector<ConstantValue> result;
    result.reserve(std::max(packed.size(), numBlocks));
    auto sliceOrAppend = [&](PackIterator iter) {
        if (rightWidth == (*iter)->bitstreamWidth())
            result.emplace_back(std::move(**iter));
        else {
            bitwidth_t bit = 0;
            result.emplace_back(slicePacked(iter, std::cend(packed), bit, rightWidth));
        }
    };

    while (numBlocks > 1) {
        size_t index = rightIndex;
        bitwidth_t width = rightWidth;
        size_t slice = sliceSize;
        if (extraBits) {
            slice = extraBits;
            extraBits = 0;
        }
        while (slice >= width) {
            index--;
            slice -= width;
            width = static_cast<bitwidth_t>(packed[index]->bitstreamWidth());
        }

        // A block composed of bits from the last "slice" bits of packed[index] to the first
        // "rightWidth" bits of packed[rightIndex].
        auto iter = std::cbegin(packed) + index;
        if (slice) {
            auto bit = static_cast<bitwidth_t>(width - slice);
            result.emplace_back(
                slicePacked(iter, std::cend(packed), bit, static_cast<bitwidth_t>(slice)));
            width -= static_cast<bitwidth_t>(slice);
        }

        iter++;
        auto nextIndex = index;
        while (++index < rightIndex)
            result.emplace_back(std::move(**iter++));

        if (index == rightIndex)
            sliceOrAppend(iter);

        rightIndex = nextIndex;
        rightWidth = width;
        numBlocks--;
    }

    // For pack, the last block may be smaller than slice size.
    auto iter = std::cbegin(packed);
    for (size_t i = 0; i < rightIndex; i++)
        result.emplace_back(std::move(**iter++));
    sliceOrAppend(iter);

    return result;
}